

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  uint uVar1;
  InternalMetadataWithArena *this_00;
  string *value;
  FileDescriptorProto *in_RSI;
  long in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff08;
  FileDescriptorProto *in_stack_ffffffffffffff10;
  FileDescriptorProto *in_stack_ffffffffffffff30;
  FileOptions *in_stack_ffffffffffffff88;
  FileOptions *in_stack_ffffffffffffff90;
  
  value = (string *)(in_RDI + 8);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffff10,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffff08);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_ffffffffffffff10,
             (RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_ffffffffffffff08);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_ffffffffffffff10,
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_ffffffffffffff08);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)in_stack_ffffffffffffff10
             ,(RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
              in_stack_ffffffffffffff08);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff10,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff08);
  RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)in_stack_ffffffffffffff90,
             (RepeatedField<int> *)in_stack_ffffffffffffff88);
  RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)in_stack_ffffffffffffff90,
             (RepeatedField<int> *)in_stack_ffffffffffffff88);
  uVar1 = (in_RSI->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_name_abi_cxx11_((FileDescriptorProto *)0x677811);
      _internal_set_name(in_stack_ffffffffffffff30,value);
    }
    if ((uVar1 & 2) != 0) {
      _internal_package_abi_cxx11_((FileDescriptorProto *)0x677837);
      _internal_set_package(in_stack_ffffffffffffff30,value);
    }
    if ((uVar1 & 4) != 0) {
      _internal_syntax_abi_cxx11_((FileDescriptorProto *)0x67785d);
      _internal_set_syntax(in_stack_ffffffffffffff30,value);
    }
    if ((uVar1 & 8) != 0) {
      _internal_mutable_options(in_stack_ffffffffffffff10);
      _internal_options(in_RSI);
      FileOptions::MergeFrom(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    if ((uVar1 & 0x10) != 0) {
      _internal_mutable_source_code_info(in_stack_ffffffffffffff10);
      _internal_source_code_info(in_RSI);
      SourceCodeInfo::MergeFrom
                ((SourceCodeInfo *)in_stack_ffffffffffffff90,
                 (SourceCodeInfo *)in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  dependency_.MergeFrom(from.dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_package(from._internal_package());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_syntax(from._internal_syntax());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::FileOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_mutable_source_code_info()->PROTOBUF_NAMESPACE_ID::SourceCodeInfo::MergeFrom(from._internal_source_code_info());
    }
  }
}